

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_MOVEFARRAY(function *fn,int A,int B,int pc)

{
  int pc_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  emit_reg(fn,"rb",B);
  membuff_add_string(&fn->body,"if (ttisfarray(rb)) { setobjs2s(L, ra, rb); }\n");
  membuff_add_string(&fn->body,"else {\n");
  membuff_add_fstring(&fn->body," error_code = %d;\n",3);
  membuff_add_string(&fn->body," goto Lraise_error;\n");
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_op_MOVEFARRAY(struct function *fn, int A, int B, int pc) {
  (void)pc;
  emit_reg(fn, "ra", A);
  emit_reg(fn, "rb", B);
  membuff_add_string(&fn->body, "if (ttisfarray(rb)) { setobjs2s(L, ra, rb); }\n");
  membuff_add_string(&fn->body, "else {\n");
#if GOTO_ON_ERROR
  membuff_add_fstring(&fn->body, " error_code = %d;\n", Error_number_array_expected);
  membuff_add_string(&fn->body, " goto Lraise_error;\n");
#else
  membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_number_array_expected);
#endif
  membuff_add_string(&fn->body, "}\n");
}